

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::vertexAttribIPointer
          (ReferenceContext *this,deUint32 index,int size,deUint32 type,int stride,void *pointer)

{
  DataBuffer *pDVar1;
  deBool dVar2;
  reference pvVar3;
  VertexArray *local_40;
  VertexArray *vao;
  void *pointer_local;
  int stride_local;
  deUint32 type_local;
  int size_local;
  deUint32 index_local;
  ReferenceContext *this_local;
  
  do {
    if ((uint)(this->m_limits).maxVertexAttribs <= index) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  while ((0 < size && (size < 5))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      while (((((type == 0x1400 || (type == 0x1401)) || (type == 0x1402)) ||
              ((type == 0x1403 || (type == 0x1404)))) || (type == 0x1405))) {
        dVar2 = ::deGetFalse();
        if (dVar2 == 0) {
          do {
            if (stride < 0) {
              setError(this,0x501);
              return;
            }
            dVar2 = ::deGetFalse();
          } while (dVar2 != 0);
          while (((this->m_vertexArrayBinding == (VertexArray *)0x0 ||
                  (this->m_arrayBufferBinding != (DataBuffer *)0x0)) || (pointer == (void *)0x0))) {
            dVar2 = ::deGetFalse();
            if (dVar2 == 0) {
              if (this->m_vertexArrayBinding == (VertexArray *)0x0) {
                local_40 = &this->m_clientVertexArray;
              }
              else {
                local_40 = this->m_vertexArrayBinding;
              }
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->size = size;
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->stride = stride;
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->type = type;
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->normalized = false;
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->integer = true;
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->pointer = pointer;
              if (this->m_arrayBufferBinding != (DataBuffer *)0x0) {
                rc::ObjectManager<sglr::rc::DataBuffer>::acquireReference
                          (&this->m_buffers,this->m_arrayBufferBinding);
              }
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              if (pvVar3->bufferBinding != (DataBuffer *)0x0) {
                pvVar3 = std::
                         vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                         ::operator[](&local_40->m_arrays,(ulong)index);
                rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
                          (&this->m_buffers,pvVar3->bufferBinding);
              }
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->bufferDeleted = false;
              pDVar1 = this->m_arrayBufferBinding;
              pvVar3 = std::
                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                       ::operator[](&local_40->m_arrays,(ulong)index);
              pvVar3->bufferBinding = pDVar1;
              return;
            }
          }
          setError(this,0x502);
          return;
        }
      }
      setError(this,0x500);
      return;
    }
  }
  setError(this,0x501);
  return;
}

Assistant:

void ReferenceContext::vertexAttribIPointer (deUint32 index, int size, deUint32 type, int stride, const void *pointer)
{
	RC_IF_ERROR(index >= (deUint32)m_limits.maxVertexAttribs, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(size <= 0 || size > 4, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(type != GL_BYTE					&&	type != GL_UNSIGNED_BYTE	&&
				type != GL_SHORT				&&	type != GL_UNSIGNED_SHORT	&&
				type != GL_INT					&&	type != GL_UNSIGNED_INT, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(stride < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(m_vertexArrayBinding != DE_NULL && m_arrayBufferBinding == DE_NULL && pointer != DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);

	vao.m_arrays[index].size			= size;
	vao.m_arrays[index].stride			= stride;
	vao.m_arrays[index].type			= type;
	vao.m_arrays[index].normalized		= false;
	vao.m_arrays[index].integer			= true;
	vao.m_arrays[index].pointer			= pointer;

	// acquire new reference
	if (m_arrayBufferBinding)
		m_buffers.acquireReference(m_arrayBufferBinding);

	// release old reference
	if (vao.m_arrays[index].bufferBinding)
		m_buffers.releaseReference(vao.m_arrays[index].bufferBinding);

	vao.m_arrays[index].bufferDeleted	= false;
	vao.m_arrays[index].bufferBinding	= m_arrayBufferBinding;
}